

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O3

Linear<std::__cxx11::basic_string<char>,_double> * __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
::_generate_linear(Linear<std::__cxx11::basic_string<char>,_double> *__return_storage_ptr__,
                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                  *this)

{
  double dVar1;
  StorageIndex *pSVar2;
  StorageIndex *pSVar3;
  StorageIndex *pSVar4;
  mapped_type *pmVar5;
  pointer pbVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  pointer pbVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  pbVar11 = (this->_idx_to_label).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (this->_idx_to_label).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar7 = (long)pbVar6 - (long)pbVar11;
  if (uVar7 != 0) {
    uVar9 = (long)uVar7 >> 5;
    uVar16 = 0;
    do {
      if ((((long)uVar9 < 0) || ((this->_quadmat).m_outerSize <= (long)uVar16)) ||
         ((this->_quadmat).m_innerSize <= (long)uVar9)) {
        __assert_fail("row>=0 && row<rows() && col>=0 && col<cols()",
                      "/usr/include/eigen3/Eigen/src/SparseCore/SparseMatrix.h",0xc0,
                      "Scalar Eigen::SparseMatrix<double, 1>::coeff(Index, Index) const [_Scalar = double, _Options = 1, _StorageIndex = int]"
                     );
      }
      pSVar2 = (this->_quadmat).m_outerIndex;
      pSVar3 = (this->_quadmat).m_innerNonZeros;
      if (pSVar3 == (StorageIndex *)0x0) {
        iVar12 = pSVar2[uVar16];
        iVar8 = pSVar2[uVar16 + 1];
      }
      else {
        iVar12 = pSVar2[uVar16];
        iVar8 = pSVar3[uVar16] + iVar12;
      }
      if (iVar12 < iVar8) {
        lVar10 = (long)iVar8;
        iVar8 = (int)(uVar7 >> 5);
        pSVar4 = (this->_quadmat).m_data.m_indices;
        lVar15 = lVar10 + -1;
        if (iVar8 != pSVar4[lVar10 + -1]) {
          lVar13 = (long)iVar12;
          while (lVar14 = lVar15, lVar13 < lVar14) {
            lVar15 = lVar14 + lVar13 >> 1;
            if (pSVar4[lVar15] < iVar8) {
              lVar13 = lVar15 + 1;
              lVar15 = lVar14;
            }
          }
          if ((lVar10 <= lVar13) || (lVar15 = lVar13, iVar8 != pSVar4[lVar13])) goto LAB_0014c95e;
        }
        dVar1 = (this->_quadmat).m_data.m_values[lVar15];
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          pmVar5 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)__return_storage_ptr__,pbVar11 + uVar16);
          *pmVar5 = dVar1;
          pbVar11 = (this->_idx_to_label).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar6 = (this->_idx_to_label).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
LAB_0014c95e:
      uVar16 = uVar16 + 1;
      uVar7 = (long)pbVar6 - (long)pbVar11;
      uVar9 = (long)uVar7 >> 5;
    } while (uVar16 < uVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Linear<IndexType, FloatType> _generate_linear() const {
      Linear<IndexType, FloatType> ret_linear;
      for ( size_t i = 0; i < _idx_to_label.size(); i++ ) {
        FloatType val = _quadmat_get( i, _idx_to_label.size() );
        if ( val != 0 )
          ret_linear[ _idx_to_label[ i ] ] = val;
      }

      return ret_linear;
    }